

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

CPubKey * HexToPubKey(CPubKey *__return_storage_ptr__,string *hex_in)

{
  size_type sVar1;
  bool bVar2;
  UniValue *pUVar3;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_str = (hex_in->_M_dataplus)._M_p;
  str._M_len = hex_in->_M_string_length;
  bVar2 = IsHex(str);
  if (bVar2) {
    sVar1 = hex_in->_M_string_length;
    if ((sVar1 == 0x42) || (sVar1 == 0x82)) {
      hex_str._M_str = (hex_in->_M_dataplus)._M_p;
      hex_str._M_len = sVar1;
      ParseHex<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,hex_str);
      CPubKey::Set<unsigned_char_const*>
                (__return_storage_ptr__,(uchar *)local_48._M_dataplus._M_p,
                 (uchar *)local_48._M_string_length);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
      bVar2 = CPubKey::IsFullyValid(__return_storage_ptr__);
      if (bVar2) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          return __return_storage_ptr__;
        }
      }
      else {
        pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
        std::operator+(&bStack_68,"Pubkey \"",hex_in);
        std::operator+(&local_48,&bStack_68,"\" must be cryptographically valid.");
        JSONRPCError(pUVar3,-5,&local_48);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
    }
    else {
      pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
      std::operator+(&bStack_68,"Pubkey \"",hex_in);
      std::operator+(&local_48,&bStack_68,"\" must have a length of either 33 or 65 bytes");
      JSONRPCError(pUVar3,-5,&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  else {
    pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
    std::operator+(&bStack_68,"Pubkey \"",hex_in);
    std::operator+(&local_48,&bStack_68,"\" must be a hex string");
    JSONRPCError(pUVar3,-5,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

CPubKey HexToPubKey(const std::string& hex_in)
{
    if (!IsHex(hex_in)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Pubkey \"" + hex_in + "\" must be a hex string");
    }
    if (hex_in.length() != 66 && hex_in.length() != 130) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Pubkey \"" + hex_in + "\" must have a length of either 33 or 65 bytes");
    }
    CPubKey vchPubKey(ParseHex(hex_in));
    if (!vchPubKey.IsFullyValid()) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Pubkey \"" + hex_in + "\" must be cryptographically valid.");
    }
    return vchPubKey;
}